

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

string * __thiscall
ser::MetainfoSet::ToString_abi_cxx11_(string *__return_storage_ptr__,MetainfoSet *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  string local_1d0;
  _Self local_1b0;
  _Self local_1a8;
  const_iterator iter;
  ostringstream local_190 [8];
  ostringstream ss;
  MetainfoSet *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"[ ");
  local_1a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ::begin(&this->data_);
  while( true ) {
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
         ::end(&this->data_);
    bVar1 = std::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
             ::operator->(&local_1a8);
    poVar3 = std::operator<<((ostream *)local_190,(string *)ppVar2);
    poVar3 = std::operator<<(poVar3,"=");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
             ::operator->(&local_1a8);
    writeAny_abi_cxx11_(&local_1d0,&ppVar2->second);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
    ::operator++(&local_1a8);
  }
  std::operator<<((ostream *)local_190,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string MetainfoSet::ToString() const
{
    std::ostringstream ss;
    ss << "[ ";

    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << iter->first << "=" << writeAny(iter->second) << " ";
    }

    ss << "]";
    return ss.str();
}